

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O0

void __thiscall InputGraph::InputGraph(InputGraph *this,int size,bool v,bool e)

{
  allocator_type *this_00;
  bimap<boost::bimaps::unordered_set_of<int,_boost::hash<int>,_std::equal_to<int>_>,_boost::bimaps::unordered_set_of<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::container::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_2U,_0U>,_mpl_::na,_mpl_::na>
  *this_01;
  pointer pIVar1;
  byte in_CL;
  byte in_DL;
  int in_ESI;
  unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *in_RDI;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  byte bVar2;
  undefined1 in_stack_ffffffffffffff9f;
  unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *puVar3;
  int size_00;
  allocator_type *al;
  allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_2U,_0U>
  local_f;
  byte local_e;
  byte local_d;
  int local_c;
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  puVar3 = in_RDI;
  local_c = in_ESI;
  this_00 = (allocator_type *)operator_new(0x100);
  size_00 = (int)((ulong)puVar3 >> 0x20);
  *(undefined4 *)this_00 = 0;
  this_00[4] = (allocator_type)0x0;
  this_00[5] = (allocator_type)0x0;
  *(unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)(this_00 + 0x18) =
       (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)0x0;
  *(unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)(this_00 + 0x20) =
       (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)0x0;
  *(unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)(this_00 + 0x28) =
       (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)0x0;
  *(unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)(this_00 + 0x30) =
       (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)0x0;
  *(unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)(this_00 + 8) =
       (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)0x0;
  *(unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)(this_00 + 0x10) =
       (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)0x0;
  *(unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)(this_00 + 0x18) =
       (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)0x0;
  *(unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)(this_00 + 0x20) =
       (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)0x0;
  al = this_00;
  std::
  map<std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x1adff4);
  *(undefined1 (*) [16])(al + 0x38) = (undefined1  [16])0x0;
  *(unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)(al + 0x48) =
       (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1ae01b);
  this_01 = (bimap<boost::bimaps::unordered_set_of<int,_boost::hash<int>,_std::equal_to<int>_>,_boost::bimaps::unordered_set_of<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::container::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_2U,_0U>,_mpl_::na,_mpl_::na>
             *)(al + 0x50);
  boost::container::
  allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_2U,_0U>
  ::allocator(&local_f);
  boost::bimaps::
  bimap<boost::bimaps::unordered_set_of<int,_boost::hash<int>,_std::equal_to<int>_>,_boost::bimaps::unordered_set_of<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::container::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_2U,_0U>,_mpl_::na,_mpl_::na>
  ::bimap(this_01,al);
  this_00[0xf8] = (allocator_type)0x0;
  this_00[0xf9] = (allocator_type)0x0;
  std::unique_ptr<InputGraph::Imp,std::default_delete<InputGraph::Imp>>::
  unique_ptr<std::default_delete<InputGraph::Imp>,void>
            (in_RDI,(pointer)CONCAT17(in_stack_ffffffffffffff9f,
                                      CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98))
            );
  bVar2 = local_d;
  pIVar1 = std::unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>::operator->
                     ((unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)0x1ae078
                     );
  pIVar1->has_vertex_labels = (bool)(bVar2 & 1);
  bVar2 = local_e;
  pIVar1 = std::unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>::operator->
                     ((unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)0x1ae094
                     );
  pIVar1->has_edge_labels = (bool)(bVar2 & 1);
  pIVar1 = std::unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>::operator->
                     ((unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)0x1ae0a8
                     );
  pIVar1->loopy = false;
  pIVar1 = std::unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>::operator->
                     ((unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)0x1ae0b9
                     );
  pIVar1->directed = false;
  if (local_c != 0) {
    resize((InputGraph *)this_00,size_00);
  }
  return;
}

Assistant:

InputGraph::InputGraph(int size, bool v, bool e) :
    _imp(new Imp{})
{
    _imp->has_vertex_labels = v;
    _imp->has_edge_labels = e;
    _imp->loopy = false;
    _imp->directed = false;

    if (0 != size)
        resize(size);
}